

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O2

bool P_LoadBuildMap(BYTE *data,size_t len,FMapThing **sprites,int *numspr)

{
  BYTE BVar1;
  ushort uVar2;
  short sVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  BYTE BVar11;
  BYTE BVar12;
  BYTE BVar13;
  BYTE BVar14;
  BYTE BVar15;
  BYTE BVar16;
  BYTE BVar17;
  BYTE BVar18;
  int iVar19;
  FDoomEdEntry *pFVar20;
  sectortype *psVar21;
  walltype *walls;
  spritetype *sprites_00;
  Xsprite *xsprites;
  ulong uVar22;
  BYTE *pBVar23;
  FMapThing *pFVar24;
  BYTE *from_;
  BYTE *pBVar25;
  undefined8 *puVar26;
  long lVar27;
  spritetype *to_;
  ulong uVar28;
  undefined8 unaff_R14;
  uint key;
  long lVar29;
  bool bVar30;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined3 uStack_70;
  undefined2 uStack_6d;
  undefined2 uStack_6b;
  undefined1 uStack_69;
  undefined1 uStack_68;
  ushort uStack_67;
  ushort uStack_65;
  undefined1 local_58 [16];
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  
  local_58._8_8_ = local_58._0_8_;
  if (len < 0x1a) {
    return false;
  }
  if (*(int *)data == 0x1a4d4c42) {
    BVar1 = data[5];
    uVar22 = CONCAT71((int7)((ulong)unaff_R14 >> 8),BVar1) & 0xfffffffe;
    bVar30 = (char)uVar22 == '\x06';
    local_38 = CONCAT71((int7)(uVar22 >> 8),bVar30);
    if (bVar30) {
      iVar19 = *(int *)(data + 0x1c);
      if (((iVar19 == 0) || (iVar19 == 0x4d617474)) || (iVar19 == 0x7474614d)) {
        uVar4 = *(undefined8 *)(data + 0x23);
        uStack_68 = (undefined1)((ulong)uVar4 >> 0x18);
        uStack_67 = (ushort)((ulong)uVar4 >> 0x20);
        uStack_65 = (ushort)((ulong)uVar4 >> 0x30);
        local_88 = *(undefined8 *)(data + 6);
        uStack_80 = *(undefined8 *)(data + 0xe);
        local_78 = *(ulong *)(data + 0x16);
        uVar4 = *(undefined8 *)(data + 0x1e);
        uStack_70 = (undefined3)uVar4;
        uStack_6d = (undefined2)((ulong)uVar4 >> 0x18);
        uStack_6b = (undefined2)((ulong)uVar4 >> 0x28);
        uStack_69 = (undefined1)((ulong)uVar4 >> 0x38);
      }
      else {
        Decrypt(&local_88,data + 6,0x25,0x7474614d);
      }
      uVar2 = uStack_67;
      bVar6 = (byte)local_78 & 0x1f;
      iVar19 = CONCAT22(uStack_6b,uStack_6d);
      numsectors = (int)CONCAT11(uStack_68,uStack_69);
      uVar28 = (ulong)uStack_65;
      lVar27 = 0;
      Printf("Visibility: %d\n",local_78 >> 0x10 & 0xffffffff);
      from_ = data + (long)(2 << bVar6) + (ulong)(BVar1 == '\a') * 0x80 + 0x2b;
      local_48 = (ulong)numsectors;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_48;
      uVar22 = 0xffffffffffffffff;
      if (SUB168(auVar5 * ZEXT816(0x28),8) == 0) {
        uVar22 = SUB168(auVar5 * ZEXT816(0x28),0);
      }
      psVar21 = (sectortype *)operator_new__(uVar22);
      walls = (walltype *)operator_new__((ulong)uVar2 << 5);
      sprites_00 = (spritetype *)operator_new__(uVar28 * 0x2c);
      local_58._0_8_ = uVar28 * 0x38;
      local_40 = uVar28;
      xsprites = (Xsprite *)operator_new__(uVar28 * 0x38);
      key = iVar19 * 0x28;
      uVar22 = 0;
      if (0 < (int)local_48) {
        uVar22 = local_48 & 0xffffffff;
      }
      for (; uVar22 * 0x28 - lVar27 != 0; lVar27 = lVar27 + 0x28) {
        puVar26 = (undefined8 *)((long)&psVar21->wallptr + lVar27);
        if (BVar1 == '\a') {
          Decrypt(puVar26,from_,0x28,key);
        }
        else {
          puVar26[4] = *(undefined8 *)(from_ + 0x20);
          uVar4 = *(undefined8 *)from_;
          uVar7 = *(undefined8 *)(from_ + 8);
          uVar8 = *(undefined8 *)(from_ + 0x18);
          puVar26[2] = *(undefined8 *)(from_ + 0x10);
          puVar26[3] = uVar8;
          *puVar26 = uVar4;
          puVar26[1] = uVar7;
        }
        pBVar25 = from_ + 0x28;
        from_ = from_ + 100;
        if (*(short *)((long)&psVar21->extra + lVar27) < 1) {
          from_ = pBVar25;
        }
      }
      for (lVar27 = 0; (ulong)uVar2 << 5 != lVar27; lVar27 = lVar27 + 0x20) {
        puVar26 = (undefined8 *)((long)&walls->x + lVar27);
        if (BVar1 == '\a') {
          Decrypt(puVar26,from_,0x20,key | 0x7474614d);
        }
        else {
          uVar4 = *(undefined8 *)from_;
          uVar7 = *(undefined8 *)(from_ + 8);
          uVar8 = *(undefined8 *)(from_ + 0x18);
          puVar26[2] = *(undefined8 *)(from_ + 0x10);
          puVar26[3] = uVar8;
          *puVar26 = uVar4;
          puVar26[1] = uVar7;
        }
        pBVar25 = from_ + 0x20;
        from_ = from_ + 0x38;
        if (*(short *)((long)&walls->extra + lVar27) < 1) {
          from_ = pBVar25;
        }
      }
      to_ = sprites_00;
      for (lVar27 = 0; local_58._0_8_ != lVar27; lVar27 = lVar27 + 0x38) {
        if (BVar1 == '\a') {
          Decrypt(to_,from_,0x2c,iVar19 * 0x2c | 0x7474614d);
        }
        else {
          uVar4 = *(undefined8 *)from_;
          uVar7 = *(undefined8 *)(from_ + 8);
          BVar11 = from_[0x10];
          BVar12 = from_[0x11];
          BVar13 = from_[0x12];
          BVar14 = from_[0x13];
          BVar15 = from_[0x14];
          BVar16 = from_[0x15];
          BVar17 = from_[0x16];
          BVar18 = from_[0x17];
          uVar8 = *(undefined8 *)(from_ + 0x18);
          uVar9 = *(undefined8 *)(from_ + 0x1c);
          uVar10 = *(undefined8 *)(from_ + 0x24);
          to_->ang = (short)uVar9;
          to_->owner = (short)((ulong)uVar9 >> 0x10);
          to_->xvel = (short)((ulong)uVar9 >> 0x20);
          to_->yvel = (short)((ulong)uVar9 >> 0x30);
          to_->zvel = (short)uVar10;
          to_->lotag = (short)((ulong)uVar10 >> 0x10);
          to_->hitag = (short)((ulong)uVar10 >> 0x20);
          to_->extra = (short)((ulong)uVar10 >> 0x30);
          to_->shade = BVar11;
          to_->pal = BVar12;
          to_->clipdist = BVar13;
          to_->filler = BVar14;
          to_->xrepeat = BVar15;
          to_->yrepeat = BVar16;
          to_->xoffset = BVar17;
          to_->yoffset = BVar18;
          to_->sectnum = (short)uVar8;
          to_->statnum = (short)((ulong)uVar8 >> 0x10);
          to_->ang = (short)((ulong)uVar8 >> 0x20);
          to_->owner = (short)((ulong)uVar8 >> 0x30);
          to_->x = (int)uVar4;
          to_->y = (int)((ulong)uVar4 >> 0x20);
          to_->z = (int)uVar7;
          to_->cstat = (short)((ulong)uVar7 >> 0x20);
          to_->picnum = (short)((ulong)uVar7 >> 0x30);
        }
        pBVar25 = from_ + 0x2c;
        pBVar23 = xsprites->NotReallyPadding + lVar27;
        if (to_->extra < 1) {
          pBVar23[0x20] = '\0';
          pBVar23[0x21] = '\0';
          pBVar23[0x22] = '\0';
          pBVar23[0x23] = '\0';
          pBVar23[0x24] = '\0';
          pBVar23[0x25] = '\0';
          pBVar23[0x26] = '\0';
          pBVar23[0x27] = '\0';
          pBVar23[0x28] = '\0';
          pBVar23[0x29] = '\0';
          pBVar23[0x2a] = '\0';
          pBVar23[0x2b] = '\0';
          pBVar23[0x2c] = '\0';
          pBVar23[0x2d] = '\0';
          pBVar23[0x2e] = '\0';
          pBVar23[0x2f] = '\0';
          *(undefined8 *)(pBVar23 + 0x10) = 0;
          *(undefined8 *)(pBVar23 + 0x18) = 0;
          pBVar23[0] = '\0';
          pBVar23[1] = '\0';
          pBVar23[2] = '\0';
          pBVar23[3] = '\0';
          pBVar23[4] = '\0';
          pBVar23[5] = '\0';
          pBVar23[6] = '\0';
          pBVar23[7] = '\0';
          pBVar23[8] = '\0';
          pBVar23[9] = '\0';
          pBVar23[10] = '\0';
          pBVar23[0xb] = '\0';
          pBVar23[0xc] = '\0';
          pBVar23[0xd] = '\0';
          pBVar23[0xe] = '\0';
          pBVar23[0xf] = '\0';
          pBVar23[0x30] = '\0';
          pBVar23[0x31] = '\0';
          pBVar23[0x32] = '\0';
          pBVar23[0x33] = '\0';
          pBVar23[0x34] = '\0';
          pBVar23[0x35] = '\0';
          pBVar23[0x36] = '\0';
          pBVar23[0x37] = '\0';
        }
        else {
          *(undefined8 *)(pBVar23 + 0x30) = *(undefined8 *)(from_ + 0x5c);
          uVar4 = *(undefined8 *)pBVar25;
          uVar7 = *(undefined8 *)(from_ + 0x34);
          uVar8 = *(undefined8 *)(from_ + 0x3c);
          uVar9 = *(undefined8 *)(from_ + 0x44);
          uVar10 = *(undefined8 *)(from_ + 0x54);
          *(undefined8 *)(pBVar23 + 0x20) = *(undefined8 *)(from_ + 0x4c);
          *(undefined8 *)(pBVar23 + 0x28) = uVar10;
          *(undefined8 *)(pBVar23 + 0x10) = uVar8;
          *(undefined8 *)(pBVar23 + 0x18) = uVar9;
          *(undefined8 *)pBVar23 = uVar4;
          *(undefined8 *)(pBVar23 + 8) = uVar7;
          pBVar25 = from_ + 100;
        }
        to_ = to_ + 1;
        from_ = pBVar25;
      }
      LoadSectors(psVar21);
      LoadWalls(walls,(uint)uVar2,psVar21);
      uVar22 = local_40;
      pFVar24 = (FMapThing *)operator_new__(local_40 * 0x90);
      *sprites = pFVar24;
      iVar19 = LoadSprites(sprites_00,xsprites,(int)uVar22,psVar21,pFVar24);
      *numspr = iVar19;
      operator_delete__(psVar21);
      operator_delete__(walls);
      operator_delete__(sprites_00);
      operator_delete__(xsprites);
    }
  }
  else {
    lVar27 = (ulong)*(ushort *)(data + 0x14) * 0x28;
    local_38 = 0;
    if ((lVar27 + 0x1aU <= len) && (*(int *)data == 7)) {
      uVar2 = *(ushort *)(data + lVar27 + 0x16);
      lVar29 = (ulong)uVar2 * 0x20;
      local_38 = 0;
      if ((lVar27 + lVar29 + 0x18U <= len) && (local_38 = 0, *(ushort *)(data + 0x10) < 0x800)) {
        psVar21 = (sectortype *)(data + 0x16);
        numsectors = (int)*(ushort *)(data + 0x14);
        LoadSectors(psVar21);
        LoadWalls((walltype *)(data + (long)numsectors * 0x28 + 0x18),(uint)uVar2,psVar21);
        uVar2 = *(ushort *)(data + lVar29 + (long)numsectors * 0x28 + 0x18);
        pFVar24 = (FMapThing *)operator_new__((ulong)uVar2 * 0x90 + 0x90);
        *sprites = pFVar24;
        iVar19 = *(int *)(data + 8);
        sVar3 = *(short *)(data + 0x10);
        local_58 = ZEXT416(*(uint *)(data + 4));
        pFVar20 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                            (&DoomEdMap,1);
        pFVar24->thingid = 0;
        (pFVar24->pos).X = (double)(int)local_58._0_4_ * 0.0625;
        (pFVar24->pos).Y = (double)-iVar19 * 0.0625;
        pFVar24->angle = (short)(((ushort)-sVar3 & 0x7ff) * 0x168 >> 0xb);
        pFVar24->SkillFilter = 0;
        pFVar24->ClassFilter = 0;
        pFVar24->EdNum = 1;
        pFVar24->info = pFVar20;
        pFVar24->flags = 0x1e7;
        pFVar24->health = 0;
        pFVar24->score = 0;
        pFVar24->pitch = 0;
        pFVar24->roll = 0;
        pFVar24->RenderStyle = 0;
        pFVar24->FloatbobPhase = 0;
        pFVar24->special = 0;
        pFVar24->args[0] = 0;
        pFVar24->args[1] = 0;
        pFVar24->args[2] = 0;
        pFVar24->args[3] = 0;
        pFVar24->args[4] = 0;
        *(undefined8 *)&pFVar24->Conversation = 0;
        *(undefined8 *)((long)&pFVar24->Gravity + 4) = 0;
        *(undefined8 *)((long)&pFVar24->Alpha + 4) = 0;
        iVar19 = LoadSprites((spritetype *)(data + lVar29 + (long)numsectors * 0x28 + 0x1a),
                             (Xsprite *)0x0,(uint)uVar2,psVar21,*sprites + 1);
        *numspr = iVar19 + 1;
        local_38 = 1;
      }
    }
  }
  return SUB81(local_38,0);
}

Assistant:

bool P_LoadBuildMap (BYTE *data, size_t len, FMapThing **sprites, int *numspr)
{
	if (len < 26)
	{
		return false;
	}

	// Check for a Blood map.
	if (*(DWORD *)data == MAKE_ID('B','L','M','\x1a'))
	{
		return P_LoadBloodMap (data, len, sprites, numspr);
	}

	const int numsec = LittleShort(*(WORD *)(data + 20));
	int numwalls;
	int numsprites;

	if (len < 26 + numsec*sizeof(sectortype) ||
		(numwalls = LittleShort(*(WORD *)(data + 22 + numsec*sizeof(sectortype))),
			len < 24 + numsec*sizeof(sectortype) + numwalls*sizeof(walltype)) ||
		LittleLong(*(DWORD *)data) != 7 ||
		LittleShort(*(WORD *)(data + 16)) >= 2048)
	{ // Can't possibly be a version 7 BUILD map
		return false;
	}

	numsectors = numsec;
	LoadSectors ((sectortype *)(data + 22));
	LoadWalls ((walltype *)(data + 24 + numsectors*sizeof(sectortype)), numwalls,
		(sectortype *)(data + 22));

	numsprites = *(WORD *)(data + 24 + numsectors*sizeof(sectortype) + numwalls*sizeof(walltype));
	*sprites = new FMapThing[numsprites + 1];
	CreateStartSpot ((SDWORD *)(data + 4), *sprites);
	*numspr = 1 + LoadSprites ((spritetype *)(data + 26 + numsectors*sizeof(sectortype) + numwalls*sizeof(walltype)),
		NULL, numsprites, (sectortype *)(data + 22), *sprites + 1);

	return true;
}